

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O1

RigidBody * __thiscall
OpenMD::MoleculeCreator::createRigidBody
          (MoleculeCreator *this,MoleculeStamp *molStamp,Molecule *mol,RigidBodyStamp *rbStamp,
          LocalIndexManager *localIndexMan)

{
  pointer piVar1;
  pointer pcVar2;
  int iVar3;
  RigidBody *this_00;
  long *plVar4;
  uint uVar5;
  RigidBodyStamp *pRVar6;
  pointer ppAVar7;
  long *plVar8;
  long lVar9;
  long lVar10;
  string s;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  pRVar6 = rbStamp;
  this_00 = (RigidBody *)operator_new(0x188);
  uVar5 = (uint)pRVar6;
  RigidBody::RigidBody(this_00);
  lVar9 = (long)(rbStamp->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(rbStamp->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 2;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    lVar10 = 0;
    do {
      piVar1 = (rbStamp->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(rbStamp->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <=
          (ulong)(lVar10 >> 0x20)) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      uVar5 = piVar1[lVar10 >> 0x20];
      ppAVar7 = (molStamp->atomStamps_).
                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      RigidBody::addAtom(this_00,(mol->atoms_).
                                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar5],
                         ppAVar7[(int)uVar5]);
      uVar5 = (uint)ppAVar7;
      lVar10 = lVar10 + 0x100000000;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  RigidBody::calcRefCoords(this_00);
  iVar3 = IndexListContainer::pop(&localIndexMan->rigidBodyIndexContainer_);
  (this_00->super_StuntDouble).localIndex_ = iVar3;
  OpenMD_itoa_abi_cxx11_
            (&local_50,
             (OpenMD *)
             ((ulong)((long)(mol->rigidBodies_).
                            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(mol->rigidBodies_).
                           super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3),10,uVar5);
  pcVar2 = (mol->molStamp_->Name).data_._M_dataplus._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + (mol->molStamp_->Name).data_._M_string_length);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_70);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar8;
    local_b0 = (long *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_80 = *plVar8;
    uStack_78 = (undefined4)plVar4[3];
    uStack_74 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar8;
    local_90 = (long *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  (*(this_00->super_StuntDouble)._vptr_StuntDouble[8])();
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return this_00;
}

Assistant:

RigidBody* MoleculeCreator::createRigidBody(
      MoleculeStamp* molStamp, Molecule* mol, RigidBodyStamp* rbStamp,
      LocalIndexManager* localIndexMan) {
    Atom* atom;
    size_t nAtoms;
    Vector3d refCoor;
    AtomStamp* atomStamp;

    RigidBody* rb = new RigidBody();
    nAtoms        = rbStamp->getNMembers();
    for (std::size_t i = 0; i < nAtoms; ++i) {
      // rbStamp->getMember(i) return the local index of current atom
      // inside the molecule.  It is not the same as local index of
      // atom which is the index of atom at DataStorage class
      atom      = mol->getAtomAt(rbStamp->getMemberAt(i));
      atomStamp = molStamp->getAtomStamp(rbStamp->getMemberAt(i));
      rb->addAtom(atom, atomStamp);
    }

    // after all of the atoms are added, we need to calculate the
    // reference coordinates
    rb->calcRefCoords();

    // set the local index of this rigid body, global index will be set later
    rb->setLocalIndex(localIndexMan->getNextRigidBodyIndex());

    // The rule for naming a rigidbody is: MoleculeName_RB_Integer
    // The first part is the name of the molecule
    // The second part is always fixed as "RB"
    // The third part is the index of the rigidbody defined in meta-data file
    // For example, Butane_RB_0 is a valid rigid body name of butane molecule

    std::string s = OpenMD_itoa(mol->getNRigidBodies(), 10);
    rb->setType(mol->getType() + "_RB_" + s.c_str());
    return rb;
  }